

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O1

void xmlFAFinishReduceEpsilonTransitions(xmlRegParserCtxtPtr ctxt,int tonr)

{
  int tonr_00;
  xmlRegStatePtr pxVar1;
  long lVar2;
  long lVar3;
  
  pxVar1 = ctxt->states[(uint)tonr];
  if (((pxVar1 != (xmlRegStatePtr)0x0) && (XML_REGEXP_MARK_START < pxVar1->mark)) &&
     (pxVar1->mark = XML_REGEXP_MARK_NORMAL, 0 < pxVar1->nbTrans)) {
    lVar3 = 8;
    lVar2 = 0;
    do {
      tonr_00 = *(int *)((long)&pxVar1->trans->atom + lVar3);
      if ((-1 < tonr_00) && (*(long *)((long)pxVar1->trans + lVar3 + -8) == 0)) {
        xmlFAFinishReduceEpsilonTransitions(ctxt,tonr_00);
      }
      lVar2 = lVar2 + 1;
      lVar3 = lVar3 + 0x18;
    } while (lVar2 < pxVar1->nbTrans);
  }
  return;
}

Assistant:

static void
xmlFAFinishReduceEpsilonTransitions(xmlRegParserCtxtPtr ctxt, int tonr) {
    int transnr;
    xmlRegStatePtr to;

    to = ctxt->states[tonr];
    if (to == NULL)
	return;
    if ((to->mark == XML_REGEXP_MARK_START) ||
	(to->mark == XML_REGEXP_MARK_NORMAL))
	return;

    to->mark = XML_REGEXP_MARK_NORMAL;
    for (transnr = 0;transnr < to->nbTrans;transnr++) {
	xmlRegTransPtr t1 = &to->trans[transnr];
	if ((t1->to >= 0) && (t1->atom == NULL))
            xmlFAFinishReduceEpsilonTransitions(ctxt, t1->to);
    }
}